

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combine_access_chains.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::CombineAccessChains::CombineIndices
          (CombineAccessChains *this,Instruction *ptr_input,Instruction *inst,
          vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *new_operands)

{
  IRContext *pIVar1;
  DefUseManager *this_00;
  ConstantManager *pCVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  uint32_t op2;
  Constant *pCVar6;
  Constant *constant_inst;
  Type *pTVar7;
  Instruction *pIVar8;
  undefined4 extraout_var;
  uint uVar9;
  CombineAccessChains *this_01;
  bool bVar10;
  InstructionBuilder builder;
  undefined1 local_a8 [40];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_80;
  Instruction *local_78;
  Instruction *local_70;
  ConstantManager *local_68;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *local_60;
  undefined1 local_58 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_38;
  
  pIVar1 = (this->super_Pass).context_;
  local_60 = new_operands;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  this_00 = (pIVar1->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
    IRContext::BuildConstantManager(pIVar1);
  }
  pCVar2 = (pIVar1->constant_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
  uVar3 = Instruction::GetSingleWordOperand
                    (ptr_input,
                     (int)((ulong)((long)(ptr_input->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(ptr_input->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x55555555 - 1);
  local_70 = analysis::DefUseManager::GetDef(this_00,uVar3);
  pCVar6 = analysis::ConstantManager::GetConstantFromInst(pCVar2,local_70);
  uVar9 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar9 = (uint)inst->has_result_id_;
  }
  uVar3 = Instruction::GetSingleWordOperand(inst,uVar9 + 1);
  local_78 = analysis::DefUseManager::GetDef(this_00,uVar3);
  constant_inst = analysis::ConstantManager::GetConstantFromInst(pCVar2,local_78);
  if (((inst->opcode_ == OpInBoundsPtrAccessChain) || (inst->opcode_ == OpPtrAccessChain)) &&
     ((ptr_input->opcode_ == OpInBoundsPtrAccessChain || (ptr_input->opcode_ == OpPtrAccessChain))))
  {
    uVar9 = (ptr_input->has_result_id_ & 1) + 1;
    if (ptr_input->has_type_id_ == false) {
      uVar9 = (uint)ptr_input->has_result_id_;
    }
    bVar10 = (int)((ulong)((long)(ptr_input->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(ptr_input->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
             uVar9 == 2;
  }
  else {
    bVar10 = false;
  }
  this_01 = this;
  local_68 = pCVar2;
  pTVar7 = GetIndexedType(this,ptr_input);
  if ((pCVar6 == (Constant *)0x0) || (constant_inst == (Constant *)0x0)) {
    iVar5 = (*pTVar7->_vptr_Type[0x1c])(pTVar7);
    uVar3 = 0;
    if ((bool)(~bVar10 & CONCAT44(extraout_var,iVar5) != 0)) {
      return false;
    }
    pIVar1 = (this->super_Pass).context_;
    local_a8._8_8_ = IRContext::get_instr_block(pIVar1,inst);
    pIVar8 = local_70;
    local_a8[0x18] = '\x03';
    local_a8[0x19] = '\0';
    local_a8[0x1a] = '\0';
    local_a8[0x1b] = '\0';
    local_a8._0_8_ = pIVar1;
    local_a8._16_8_ = inst;
    if (local_70->has_type_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(local_70,0);
    }
    op2 = 0;
    uVar4 = 0;
    if (pIVar8->has_result_id_ == true) {
      uVar4 = Instruction::GetSingleWordOperand(pIVar8,(uint)pIVar8->has_type_id_);
    }
    if (local_78->has_result_id_ == true) {
      op2 = Instruction::GetSingleWordOperand(local_78,(uint)local_78->has_type_id_);
    }
    pIVar8 = InstructionBuilder::AddIAdd((InstructionBuilder *)local_a8,uVar3,uVar4,op2);
  }
  else {
    uVar3 = GetConstantValue(this_01,pCVar6);
    uVar4 = GetConstantValue(this_01,constant_inst);
    pTVar7 = pCVar6->type_;
    local_a8._0_8_ = (IRContext *)0x0;
    local_a8._8_8_ = (BasicBlock *)0x0;
    local_a8._16_8_ = (Instruction *)0x0;
    local_a8._0_8_ = operator_new(4);
    pCVar2 = local_68;
    local_a8._8_8_ = (long)&((IRContext *)local_a8._0_8_)->syntax_context_ + 4;
    *(uint32_t *)&((IRContext *)local_a8._0_8_)->syntax_context_ = uVar4 + uVar3;
    local_a8._16_8_ = local_a8._8_8_;
    pCVar6 = analysis::ConstantManager::GetConstant
                       (local_68,pTVar7,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
    if ((IRContext *)local_a8._0_8_ != (IRContext *)0x0) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ - local_a8._0_8_);
    }
    pIVar8 = analysis::ConstantManager::GetDefiningInstruction(pCVar2,pCVar6,0,(inst_iterator *)0x0)
    ;
  }
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  if (pIVar8->has_result_id_ == true) {
    local_58._16_4_ = Instruction::GetSingleWordOperand(pIVar8,(uint)pIVar8->has_type_id_);
  }
  local_58._24_8_ = local_58 + 0x10;
  local_58._0_8_ = &PTR__SmallVector_003e9b28;
  local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_58._8_8_ = 1;
  local_a8._0_4_ = 1;
  local_a8._8_8_ = &PTR__SmallVector_003e9b28;
  local_a8._16_8_ = (Instruction *)0x0;
  local_a8._32_8_ = local_a8 + 0x18;
  local_80._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_a8 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_58);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(local_60,(Operand *)local_a8);
  local_a8._8_8_ = &PTR__SmallVector_003e9b28;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_80._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_80,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               local_80._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl);
  }
  local_80._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_58._0_8_ = &PTR__SmallVector_003e9b28;
  if (local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_38,local_38._M_head_impl);
  }
  return true;
}

Assistant:

bool CombineAccessChains::CombineIndices(Instruction* ptr_input,
                                         Instruction* inst,
                                         std::vector<Operand>* new_operands) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  analysis::ConstantManager* constant_mgr = context()->get_constant_mgr();

  Instruction* last_index_inst = def_use_mgr->GetDef(
      ptr_input->GetSingleWordInOperand(ptr_input->NumInOperands() - 1));
  const analysis::Constant* last_index_constant =
      constant_mgr->GetConstantFromInst(last_index_inst);

  Instruction* element_inst =
      def_use_mgr->GetDef(inst->GetSingleWordInOperand(1));
  const analysis::Constant* element_constant =
      constant_mgr->GetConstantFromInst(element_inst);

  // Combine the last index of the AccessChain (|ptr_inst|) with the element
  // operand of the PtrAccessChain (|inst|).
  const bool combining_element_operands =
      IsPtrAccessChain(inst->opcode()) &&
      IsPtrAccessChain(ptr_input->opcode()) && ptr_input->NumInOperands() == 2;
  uint32_t new_value_id = 0;
  const analysis::Type* type = GetIndexedType(ptr_input);
  if (last_index_constant && element_constant) {
    // Combine the constants.
    uint32_t new_value = GetConstantValue(last_index_constant) +
                         GetConstantValue(element_constant);
    const analysis::Constant* new_value_constant =
        constant_mgr->GetConstant(last_index_constant->type(), {new_value});
    Instruction* new_value_inst =
        constant_mgr->GetDefiningInstruction(new_value_constant);
    new_value_id = new_value_inst->result_id();
  } else if (!type->AsStruct() || combining_element_operands) {
    // Generate an addition of the two indices.
    InstructionBuilder builder(
        context(), inst,
        IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
    Instruction* addition = builder.AddIAdd(last_index_inst->type_id(),
                                            last_index_inst->result_id(),
                                            element_inst->result_id());
    new_value_id = addition->result_id();
  } else {
    // Indexing into structs must be constant, so bail out here.
    return false;
  }
  new_operands->push_back({SPV_OPERAND_TYPE_ID, {new_value_id}});
  return true;
}